

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::activation_object::get
          (value *__return_storage_ptr__,activation_object *this,wstring_view *name)

{
  object *poVar1;
  gc_string *this_00;
  wstring_view local_40;
  gc_heap *local_30;
  gc_heap *h;
  param *p;
  wstring_view *name_local;
  activation_object *this_local;
  
  p = (param *)name;
  name_local = (wstring_view *)this;
  this_local = (activation_object *)__return_storage_ptr__;
  h = (gc_heap *)find(this,name);
  if (h == (gc_heap *)0x0) {
    object::get(__return_storage_ptr__,&this->super_object,(wstring_view *)p);
  }
  else {
    local_30 = object::heap(&this->super_object);
    poVar1 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->arguments_,local_30);
    this_00 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                        ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)
                         ((long)&(h->pointers_).set_ + 4),local_30);
    local_40 = gc_string::view(this_00);
    (**poVar1->_vptr_object)(__return_storage_ptr__,poVar1,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

value get(const std::wstring_view& name) const override {
        if (auto p = find(name)) {
            auto& h = heap();
            return arguments_.dereference(h).get(p->index_string.dereference(h).view());
        }
        return object::get(name);
    }